

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::
CmpHelperEQ<__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>,__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>>
          (char *expected_expression,char *actual_expression,
          __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
          *expected,
          __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
          *actual)

{
  bool bVar1;
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
  *in_RDI;
  undefined8 in_R8;
  AssertionResult AVar3;
  __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
  *in_stack_ffffffffffffff70;
  __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
  *value;
  string local_68 [32];
  string local_48 [39];
  undefined1 ignoring_case;
  string *expected_value;
  __normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
  *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  ignoring_case = (undefined1)((ulong)in_R8 >> 0x38);
  value = in_RDI;
  expected_expression_00 = in_RDI;
  bVar1 = __gnu_cxx::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    expected_value = in_RDX;
    FormatForComparisonFailureMessage<__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>,__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>>
              (value,(__normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
                      *)in_RDX);
    FormatForComparisonFailureMessage<__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>,__gnu_cxx::__normal_iterator<mp::Solver::SuffixInfo_const*,std::vector<mp::Solver::SuffixInfo,std::allocator<mp::Solver::SuffixInfo>>>>
              (value,(__normal_iterator<const_mp::Solver::SuffixInfo_*,_std::vector<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>_>
                      *)in_RDX);
    EqFailure((char *)expected_expression_00,in_RSI,expected_value,in_RCX,(bool)ignoring_case);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}